

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LlvmModule * CompileLlvm(ExpressionContext *exprCtx,ExprModule *expression)

{
  InplaceStr *pIVar1;
  TypeBase *pTVar2;
  LLVMValueRefOpaque *pLVar3;
  undefined8 uVar4;
  LLVMContextRef pLVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  TypeBase **ppTVar11;
  LLVMTypeRef pLVar12;
  LLVMValueRef pLVar13;
  FunctionData **ppFVar14;
  LLVMValueRefOpaque **ppLVar15;
  char *pcVar16;
  LLVMAttributeRef pLVar17;
  VariableData **ppVVar18;
  ScopeData *pSVar19;
  LLVMValueRef pLVar20;
  ExprBase **ppEVar21;
  LLVMMemoryBufferRef pLVar22;
  undefined4 extraout_var;
  ArrayView<TypeBase_*> argumentTypes;
  ArrayView<TypeBase_*> argumentTypes_00;
  ArrayView<TypeBase_*> argumentTypes_01;
  ArrayView<TypeBase_*> argumentTypes_02;
  ArrayView<TypeBase_*> argumentTypes_03;
  ArrayView<TypeBase_*> argumentTypes_04;
  ArrayView<TypeBase_*> argumentTypes_05;
  ArrayView<TypeBase_*> argumentTypes_06;
  ArrayView<TypeBase_*> argumentTypes_07;
  char *start;
  LLVMMemoryBufferRef buffer;
  LlvmModule *module;
  char *local_1598;
  char *error;
  ExprBase *local_1580;
  ExprBase *value_2;
  ExprBase *value_1;
  LLVMBasicBlockRef block;
  LLVMValueRef function_11;
  char *pcStack_1558;
  uint i_4;
  undefined8 uStack_1550;
  LLVMValueRef local_1540;
  LLVMValueRef value;
  VariableData *variable;
  FunctionData *pFStack_1528;
  uint i_3;
  FunctionData *function_10;
  LLVMValueRef pLStack_1518;
  uint i_2;
  LLVMValueRef llvmFunction;
  FunctionData *function_9;
  ArrayView<TypeBase*> aAStack_1500 [4];
  uint i_1;
  undefined4 local_14f8;
  LLVMValueRef local_14f0;
  LLVMValueRef function_8;
  TypeBase *arguments_7 [3];
  undefined4 local_14c8;
  LLVMValueRef function_7;
  TypeBase *arguments_6 [1];
  undefined4 local_14a8;
  LLVMValueRef function_6;
  TypeBase *arguments_5 [1];
  undefined4 local_1488;
  LLVMValueRef function_5;
  TypeBase *arguments_4 [1];
  undefined4 local_1468;
  LLVMValueRef function_4;
  TypeBase *arguments_3 [2];
  ArrayView<TypeBase*> local_1440 [16];
  LLVMValueRef local_1430;
  LLVMValueRef function_3;
  TypeBase *arguments_2 [2];
  ArrayView<TypeBase*> local_1410 [16];
  LLVMValueRef local_1400;
  LLVMValueRef function_2;
  TypeBase *arguments_1 [2];
  ArrayView<TypeBase*> local_13e0 [16];
  LLVMValueRef local_13d0;
  LLVMValueRef function_1;
  TypeBase *arguments [2];
  undefined1 local_13b0 [12];
  LLVMValueRef local_13a0;
  LLVMValueRef function;
  undefined1 auStack_1390 [4];
  uint i;
  LlvmCompilationContext ctx;
  TraceScope traceScope;
  ExprModule *expression_local;
  ExpressionContext *exprCtx_local;
  
  if ((CompileLlvm(ExpressionContext&,ExprModule*)::token == '\0') &&
     (iVar7 = __cxa_guard_acquire(&CompileLlvm(ExpressionContext&,ExprModule*)::token), iVar7 != 0))
  {
    CompileLlvm::token = NULLC::TraceGetToken("InstructionTreeLlvm","CompileLlvm");
    __cxa_guard_release(&CompileLlvm(ExpressionContext&,ExprModule*)::token);
  }
  NULLC::TraceScope::TraceScope((TraceScope *)&ctx.allocator,CompileLlvm::token);
  LlvmCompilationContext::LlvmCompilationContext((LlvmCompilationContext *)auStack_1390,exprCtx);
  ctx._8_8_ = LLVMContextCreate();
  ctx.context = (LLVMContextRef)
                LLVMModuleCreateWithNameInContext("module",(LLVMContextRef)ctx._8_8_);
  ctx.module = (LLVMModuleRef)LLVMCreateBuilderInContext((LLVMContextRef)ctx._8_8_);
  ctx.builder = (LLVMBuilderRef)LLVMCreateFunctionPassManagerForModule((LLVMModuleRef)ctx.context);
  LLVMAddBasicAliasAnalysisPass((LLVMPassManagerRef)ctx.builder);
  if (((byte)ctx.ctx & 1) != 0) {
    LLVMAddScalarReplAggregatesPass((LLVMPassManagerRef)ctx.builder);
    LLVMAddInstructionCombiningPass((LLVMPassManagerRef)ctx.builder);
    LLVMAddEarlyCSEPass((LLVMPassManagerRef)ctx.builder);
    LLVMAddReassociatePass((LLVMPassManagerRef)ctx.builder);
    LLVMAddGVNPass((LLVMPassManagerRef)ctx.builder);
    LLVMAddConstantPropagationPass((LLVMPassManagerRef)ctx.builder);
  }
  LLVMAddCFGSimplificationPass((LLVMPassManagerRef)ctx.builder);
  LLVMAddAggressiveDCEPass((LLVMPassManagerRef)ctx.builder);
  LLVMInitializeFunctionPassManager((LLVMPassManagerRef)ctx.builder);
  for (function._4_4_ = 0; uVar9 = function._4_4_,
      uVar8 = SmallArray<TypeBase_*,_128U>::size(&_auStack_1390->types), uVar10 = function._4_4_,
      uVar9 < uVar8; function._4_4_ = function._4_4_ + 1) {
    ppTVar11 = SmallArray<TypeBase_*,_128U>::operator[](&_auStack_1390->types,function._4_4_);
    (*ppTVar11)->typeIndex = uVar10;
  }
  uVar9 = SmallArray<TypeBase_*,_128U>::size(&_auStack_1390->types);
  SmallArray<LLVMTypeRefOpaque_*,_128U>::resize
            ((SmallArray<LLVMTypeRefOpaque_*,_128U> *)&ctx.functionPassManager,uVar9);
  memset(ctx.functionPassManager,0,(ulong)(uint)ctx.types.data << 3);
  uVar9 = SmallArray<FunctionData_*,_128U>::size(&_auStack_1390->functions);
  SmallArray<LLVMValueRefOpaque_*,_128U>::resize
            ((SmallArray<LLVMValueRefOpaque_*,_128U> *)&ctx.types.allocator,uVar9);
  memset(ctx.types.allocator,0,(ulong)(uint)ctx.functions.data << 3);
  pLVar5 = ctx.context;
  pTVar2 = _auStack_1390->typeVoid;
  ArrayView<TypeBase_*>::ArrayView((ArrayView<TypeBase_*> *)local_13b0);
  argumentTypes._12_4_ = 0;
  argumentTypes.data = (TypeBase **)local_13b0._0_8_;
  argumentTypes.count = local_13b0._8_4_;
  pLVar12 = CompileLlvmFunctionType((LlvmCompilationContext *)auStack_1390,pTVar2,argumentTypes);
  local_13a0 = LLVMAddFunction((LLVMModuleRef)pLVar5,"__llvmAbortNoReturn",pLVar12);
  LLVMSetLinkage(local_13a0,LLVMExternalLinkage);
  pLVar5 = ctx.context;
  function_1 = (LLVMValueRef)_auStack_1390->typeAutoRef;
  arguments[0] = _auStack_1390->typeTypeID;
  pTVar2 = _auStack_1390->typeNullPtr;
  ArrayView<TypeBase*>::ArrayView<2u>(local_13e0,(TypeBase *(*) [2])&function_1);
  argumentTypes_00._12_4_ = 0;
  argumentTypes_00._0_12_ = local_13e0._0_12_;
  pLVar12 = CompileLlvmFunctionType((LlvmCompilationContext *)auStack_1390,pTVar2,argumentTypes_00);
  local_13d0 = LLVMAddFunction((LLVMModuleRef)pLVar5,"__llvmConvertPtr",pLVar12);
  LLVMSetLinkage(local_13d0,LLVMExternalLinkage);
  pLVar5 = ctx.context;
  function_2 = (LLVMValueRef)_auStack_1390->typeInt;
  arguments_1[0] = _auStack_1390->typeInt;
  pTVar2 = _auStack_1390->typeInt;
  ArrayView<TypeBase*>::ArrayView<2u>(local_1410,(TypeBase *(*) [2])&function_2);
  argumentTypes_01._12_4_ = 0;
  argumentTypes_01._0_12_ = local_1410._0_12_;
  pLVar12 = CompileLlvmFunctionType((LlvmCompilationContext *)auStack_1390,pTVar2,argumentTypes_01);
  local_1400 = LLVMAddFunction((LLVMModuleRef)pLVar5,"__llvmPowInt",pLVar12);
  LLVMSetLinkage(local_1400,LLVMExternalLinkage);
  pLVar5 = ctx.context;
  function_3 = (LLVMValueRef)_auStack_1390->typeLong;
  arguments_2[0] = _auStack_1390->typeLong;
  pTVar2 = _auStack_1390->typeLong;
  ArrayView<TypeBase*>::ArrayView<2u>(local_1440,(TypeBase *(*) [2])&function_3);
  argumentTypes_02._12_4_ = 0;
  argumentTypes_02._0_12_ = local_1440._0_12_;
  pLVar12 = CompileLlvmFunctionType((LlvmCompilationContext *)auStack_1390,pTVar2,argumentTypes_02);
  local_1430 = LLVMAddFunction((LLVMModuleRef)pLVar5,"__llvmPowLong",pLVar12);
  LLVMSetLinkage(local_1430,LLVMExternalLinkage);
  pLVar5 = ctx.context;
  function_4 = (LLVMValueRef)_auStack_1390->typeDouble;
  arguments_3[0] = _auStack_1390->typeDouble;
  pTVar2 = _auStack_1390->typeDouble;
  ArrayView<TypeBase*>::ArrayView<2u>
            ((ArrayView<TypeBase*> *)arguments_4,(TypeBase *(*) [2])&function_4);
  argumentTypes_03._12_4_ = 0;
  argumentTypes_03.data = (TypeBase **)arguments_4[0];
  argumentTypes_03.count = local_1468;
  pLVar12 = CompileLlvmFunctionType((LlvmCompilationContext *)auStack_1390,pTVar2,argumentTypes_03);
  pLVar13 = LLVMAddFunction((LLVMModuleRef)pLVar5,"__llvmPowDouble",pLVar12);
  LLVMSetLinkage(pLVar13,LLVMExternalLinkage);
  pLVar5 = ctx.context;
  function_5 = (LLVMValueRef)_auStack_1390->typeInt;
  pTVar2 = _auStack_1390->typeVoid;
  ArrayView<TypeBase*>::ArrayView<1u>
            ((ArrayView<TypeBase*> *)arguments_5,(TypeBase *(*) [1])&function_5);
  argumentTypes_04._12_4_ = 0;
  argumentTypes_04.data = (TypeBase **)arguments_5[0];
  argumentTypes_04.count = local_1488;
  pLVar12 = CompileLlvmFunctionType((LlvmCompilationContext *)auStack_1390,pTVar2,argumentTypes_04);
  pLVar13 = LLVMAddFunction((LLVMModuleRef)pLVar5,"__llvmReturnInt",pLVar12);
  LLVMSetLinkage(pLVar13,LLVMExternalLinkage);
  pLVar5 = ctx.context;
  function_6 = (LLVMValueRef)_auStack_1390->typeLong;
  pTVar2 = _auStack_1390->typeVoid;
  ArrayView<TypeBase*>::ArrayView<1u>
            ((ArrayView<TypeBase*> *)arguments_6,(TypeBase *(*) [1])&function_6);
  argumentTypes_05._12_4_ = 0;
  argumentTypes_05.data = (TypeBase **)arguments_6[0];
  argumentTypes_05.count = local_14a8;
  pLVar12 = CompileLlvmFunctionType((LlvmCompilationContext *)auStack_1390,pTVar2,argumentTypes_05);
  pLVar13 = LLVMAddFunction((LLVMModuleRef)pLVar5,"__llvmReturnLong",pLVar12);
  LLVMSetLinkage(pLVar13,LLVMExternalLinkage);
  pLVar5 = ctx.context;
  function_7 = (LLVMValueRef)_auStack_1390->typeDouble;
  pTVar2 = _auStack_1390->typeVoid;
  ArrayView<TypeBase*>::ArrayView<1u>
            ((ArrayView<TypeBase*> *)(arguments_7 + 2),(TypeBase *(*) [1])&function_7);
  argumentTypes_06._12_4_ = 0;
  argumentTypes_06.data = (TypeBase **)arguments_7[2];
  argumentTypes_06.count = local_14c8;
  pLVar12 = CompileLlvmFunctionType((LlvmCompilationContext *)auStack_1390,pTVar2,argumentTypes_06);
  pLVar13 = LLVMAddFunction((LLVMModuleRef)pLVar5,"__llvmReturnDouble",pLVar12);
  LLVMSetLinkage(pLVar13,LLVMExternalLinkage);
  pLVar5 = ctx.context;
  function_8 = (LLVMValueRef)_auStack_1390->typeInt;
  arguments_7[0] = _auStack_1390->typeNullPtr;
  arguments_7[1] = _auStack_1390->typeNullPtr;
  pTVar2 = _auStack_1390->typeVoid;
  ArrayView<TypeBase*>::ArrayView<3u>(aAStack_1500,(TypeBase *(*) [3])&function_8);
  argumentTypes_07._12_4_ = 0;
  argumentTypes_07.data = (TypeBase **)_aAStack_1500;
  argumentTypes_07.count = local_14f8;
  pLVar12 = CompileLlvmFunctionType((LlvmCompilationContext *)auStack_1390,pTVar2,argumentTypes_07);
  local_14f0 = LLVMAddFunction((LLVMModuleRef)pLVar5,"__llvmExternalCall",pLVar12);
  LLVMSetLinkage(local_14f0,LLVMExternalLinkage);
  for (function_9._4_4_ = 0; uVar9 = function_9._4_4_,
      uVar10 = SmallArray<FunctionData_*,_128U>::size(&_auStack_1390->functions), uVar9 < uVar10;
      function_9._4_4_ = function_9._4_4_ + 1) {
    ppFVar14 = SmallArray<FunctionData_*,_128U>::operator[]
                         (&_auStack_1390->functions,function_9._4_4_);
    llvmFunction = (LLVMValueRef)*ppFVar14;
    bVar6 = ExpressionContext::IsGenericFunction(_auStack_1390,(FunctionData *)llvmFunction);
    if ((!bVar6) &&
       (((((byte)llvmFunction[0x148] & 1) == 0 || (*(long *)(llvmFunction + 0x150) == 0)) &&
        (ppLVar15 = SmallArray<LLVMValueRefOpaque_*,_128U>::operator[]
                              ((SmallArray<LLVMValueRefOpaque_*,_128U> *)&ctx.types.allocator,
                               *(uint *)(llvmFunction + 0x44)), pLVar5 = ctx.context,
        *ppLVar15 == (LLVMValueRefOpaque *)0x0)))) {
      pcVar16 = CreateLlvmFunctionName
                          ((LlvmCompilationContext *)auStack_1390,(FunctionData *)llvmFunction);
      pLVar12 = CompileLlvmFunctionType
                          ((LlvmCompilationContext *)auStack_1390,
                           *(TypeFunction **)(llvmFunction + 0x28));
      pLStack_1518 = LLVMAddFunction((LLVMModuleRef)pLVar5,pcVar16,pLVar12);
      bVar6 = IsStructReturnType(*(TypeBase **)(*(long *)(llvmFunction + 0x28) + 0x60));
      uVar4 = ctx._8_8_;
      pLVar13 = pLStack_1518;
      if (bVar6) {
        uVar9 = LLVMGetEnumAttributeKindForName("nonnull",7);
        pLVar17 = LLVMCreateEnumAttribute((LLVMContextRef)uVar4,uVar9,0);
        LLVMAddAttributeAtIndex(pLVar13,1,pLVar17);
        uVar4 = ctx._8_8_;
        pLVar13 = pLStack_1518;
        uVar9 = LLVMGetEnumAttributeKindForName("sret",4);
        pLVar17 = LLVMCreateEnumAttribute((LLVMContextRef)uVar4,uVar9,0);
        LLVMAddAttributeAtIndex(pLVar13,1,pLVar17);
      }
      pLVar3 = pLStack_1518;
      ppLVar15 = SmallArray<LLVMValueRefOpaque_*,_128U>::operator[]
                           ((SmallArray<LLVMValueRefOpaque_*,_128U> *)&ctx.types.allocator,
                            *(uint *)(llvmFunction + 0x44));
      *ppLVar15 = pLVar3;
      if ((*(long *)(llvmFunction + 8) == 0) && (((byte)llvmFunction[0x148] & 1) != 0)) {
        CompileLlvmExternalFunctionWrapper
                  ((LlvmCompilationContext *)auStack_1390,(FunctionData *)llvmFunction);
      }
    }
  }
  for (function_10._4_4_ = 0; uVar9 = function_10._4_4_,
      uVar10 = SmallArray<FunctionData_*,_128U>::size(&_auStack_1390->functions), uVar9 < uVar10;
      function_10._4_4_ = function_10._4_4_ + 1) {
    ppFVar14 = SmallArray<FunctionData_*,_128U>::operator[]
                         (&_auStack_1390->functions,function_10._4_4_);
    pFStack_1528 = *ppFVar14;
    if (((pFStack_1528->isPrototype & 1U) != 0) &&
       (pFStack_1528->implementation != (FunctionData *)0x0)) {
      ppLVar15 = SmallArray<LLVMValueRefOpaque_*,_128U>::operator[]
                           ((SmallArray<LLVMValueRefOpaque_*,_128U> *)&ctx.types.allocator,
                            pFStack_1528->implementation->functionIndex);
      pLVar3 = *ppLVar15;
      ppLVar15 = SmallArray<LLVMValueRefOpaque_*,_128U>::operator[]
                           ((SmallArray<LLVMValueRefOpaque_*,_128U> *)&ctx.types.allocator,
                            pFStack_1528->functionIndex);
      *ppLVar15 = pLVar3;
    }
  }
  variable._4_4_ = 0;
  do {
    uVar9 = variable._4_4_;
    uVar10 = SmallArray<VariableData_*,_128U>::size(&_auStack_1390->variables);
    if (uVar10 <= uVar9) {
      for (function_11._4_4_ = 0; uVar9 = function_11._4_4_,
          uVar10 = SmallArray<ExprBase_*,_32U>::size(&expression->definitions), pLVar5 = ctx.context
          , uVar9 < uVar10; function_11._4_4_ = function_11._4_4_ + 1) {
        ppEVar21 = SmallArray<ExprBase_*,_32U>::operator[]
                             (&expression->definitions,function_11._4_4_);
        CompileLlvm((LlvmCompilationContext *)auStack_1390,*ppEVar21);
      }
      ctx.variables.allocator._0_1_ = 1;
      pLVar12 = LLVMVoidTypeInContext((LLVMContextRef)ctx._8_8_);
      pLVar12 = LLVMFunctionType(pLVar12,(LLVMTypeRef *)0x0,0,false);
      block = (LLVMBasicBlockRef)LLVMAddFunction((LLVMModuleRef)pLVar5,"__llvmEntry",pLVar12);
      LLVMSetLinkage((LLVMValueRef)block,LLVMExternalLinkage);
      ctx._4216_8_ = block;
      ctx.currentFunctionSource._0_1_ = 1;
      value_1 = (ExprBase *)
                LLVMAppendBasicBlockInContext((LLVMContextRef)ctx._8_8_,(LLVMValueRef)block,"start")
      ;
      LLVMPositionBuilderAtEnd((LLVMBuilderRef)ctx.module,(LLVMBasicBlockRef)value_1);
      for (value_2 = (expression->setup).head; value_2 != (ExprBase *)0x0; value_2 = value_2->next)
      {
        CompileLlvm((LlvmCompilationContext *)auStack_1390,value_2);
      }
      for (local_1580 = (expression->expressions).head; local_1580 != (ExprBase *)0x0;
          local_1580 = local_1580->next) {
        CompileLlvm((LlvmCompilationContext *)auStack_1390,local_1580);
      }
      LLVMBuildRetVoid((LLVMBuilderRef)ctx.module);
      uVar4 = ctx._4216_8_;
      InplaceStr::InplaceStr((InplaceStr *)&error,"global");
      CheckFunction((LlvmCompilationContext *)auStack_1390,(LLVMValueRef)uVar4,_error);
      iVar7 = LLVMRunFunctionPassManager((LLVMPassManagerRef)ctx.builder,(LLVMValueRef)block);
      if (iVar7 != 0) {
        LLVMRunFunctionPassManager((LLVMPassManagerRef)ctx.builder,(LLVMValueRef)block);
      }
      ctx.skipFunctionDefinitions = false;
      ctx._4217_7_ = 0;
      ctx.currentFunctionSource._0_1_ = 0;
      LLVMFinalizeFunctionPassManager((LLVMPassManagerRef)ctx.builder);
      local_1598 = (char *)0x0;
      iVar7 = LLVMVerifyModule((LLVMModuleRef)ctx.context,LLVMReturnStatusAction,&local_1598);
      if (iVar7 == 0) {
        LLVMDisposeMessage(local_1598);
        exprCtx_local =
             (ExpressionContext *)
             LlvmCompilationContext::get<LlvmModule>((LlvmCompilationContext *)auStack_1390);
        LlvmModule::LlvmModule((LlvmModule *)exprCtx_local);
        pLVar22 = LLVMWriteBitcodeToMemoryBuffer((LLVMModuleRef)ctx.context);
        uVar9 = LLVMGetBufferSize(pLVar22);
        *(uint *)&exprCtx_local->code = uVar9;
        iVar7 = (*(ctx.loopInfo.allocator)->_vptr_Allocator[2])
                          (ctx.loopInfo.allocator,(ulong)*(uint *)&exprCtx_local->code);
        *(ulong *)exprCtx_local = CONCAT44(extraout_var,iVar7);
        pcVar16 = LLVMGetBufferStart(pLVar22);
        if (pcVar16 != (char *)0x0) {
          memcpy(*(void **)exprCtx_local,pcVar16,(ulong)*(uint *)&exprCtx_local->code);
        }
        LLVMDisposeMemoryBuffer(pLVar22);
        LLVMDisposePassManager((LLVMPassManagerRef)ctx.builder);
        LLVMDisposeBuilder((LLVMBuilderRef)ctx.module);
        LLVMDisposeModule((LLVMModuleRef)ctx.context);
        LLVMContextDispose((LLVMContextRef)ctx._8_8_);
      }
      else {
        printf("LLVM module verification failed with:\n%s\n",local_1598);
        LLVMDisposeMessage(local_1598);
        LLVMDisposePassManager((LLVMPassManagerRef)ctx.builder);
        LLVMDisposeBuilder((LLVMBuilderRef)ctx.module);
        LLVMDisposeModule((LLVMModuleRef)ctx.context);
        LLVMContextDispose((LLVMContextRef)ctx._8_8_);
        exprCtx_local = (ExpressionContext *)0x0;
      }
      LlvmCompilationContext::~LlvmCompilationContext((LlvmCompilationContext *)auStack_1390);
      NULLC::TraceScope::~TraceScope((TraceScope *)&ctx.allocator);
      return (LlvmModule *)exprCtx_local;
    }
    ppVVar18 = SmallArray<VariableData_*,_128U>::operator[]
                         (&_auStack_1390->variables,variable._4_4_);
    value = (LLVMValueRef)*ppVVar18;
    pSVar19 = ExpressionContext::GlobalScopeFrom(_auStack_1390,((VariableData *)value)->scope);
    pLVar5 = ctx.context;
    if (pSVar19 != (ScopeData *)0x0) {
      pLVar12 = CompileLlvmType((LlvmCompilationContext *)auStack_1390,*(TypeBase **)(value + 0x20))
      ;
      pIVar1 = (InplaceStr *)(*(long *)(value + 0x28) + 0x40);
      pcStack_1558 = pIVar1->begin;
      uStack_1550 = *(undefined8 *)(*(long *)(value + 0x28) + 0x48);
      pcVar16 = CreateLlvmName((LlvmCompilationContext *)auStack_1390,*pIVar1);
      pLVar13 = LLVMAddGlobal((LLVMModuleRef)pLVar5,pLVar12,pcVar16);
      local_1540 = pLVar13;
      if (*(long *)(value + 8) == 0) {
        pLVar12 = CompileLlvmType((LlvmCompilationContext *)auStack_1390,
                                  *(TypeBase **)(value + 0x20));
        pLVar20 = LLVMConstNull(pLVar12);
        LLVMSetInitializer(pLVar13,pLVar20);
      }
      ppLVar15 = SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>
                 ::find((SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>
                         *)&ctx.functions.allocator,(uint *)(value + 0x40));
      if (ppLVar15 != (LLVMValueRefOpaque **)0x0) {
        __assert_fail("!ctx.variables.find(variable->uniqueId)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                      ,0xa25,"LlvmModule *CompileLlvm(ExpressionContext &, ExprModule *)");
      }
      SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::insert
                ((SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>
                  *)&ctx.functions.allocator,(uint *)(value + 0x40),&local_1540);
    }
    variable._4_4_ = variable._4_4_ + 1;
  } while( true );
}

Assistant:

LlvmModule* CompileLlvm(ExpressionContext &exprCtx, ExprModule *expression)
{
	TRACE_SCOPE("InstructionTreeLlvm", "CompileLlvm");

	LlvmCompilationContext ctx(exprCtx);

	ctx.context = LLVMContextCreate();

	ctx.module = LLVMModuleCreateWithNameInContext("module", ctx.context);

	ctx.builder = LLVMCreateBuilderInContext(ctx.context);

	ctx.functionPassManager = LLVMCreateFunctionPassManagerForModule(ctx.module);

	LLVMAddBasicAliasAnalysisPass(ctx.functionPassManager);

	if(ctx.enableOptimization)
	{
		LLVMAddScalarReplAggregatesPass(ctx.functionPassManager);
		LLVMAddInstructionCombiningPass(ctx.functionPassManager);
		LLVMAddEarlyCSEPass(ctx.functionPassManager);
		LLVMAddReassociatePass(ctx.functionPassManager);
		LLVMAddGVNPass(ctx.functionPassManager);
		LLVMAddConstantPropagationPass(ctx.functionPassManager);
	}

	LLVMAddCFGSimplificationPass(ctx.functionPassManager);
	LLVMAddAggressiveDCEPass(ctx.functionPassManager);

	LLVMInitializeFunctionPassManager(ctx.functionPassManager);

	// Generate type indexes
	for(unsigned i = 0; i < ctx.ctx.types.size(); i++)
		ctx.ctx.types[i]->typeIndex = i;

	// Reserve types, generate as required
	ctx.types.resize(ctx.ctx.types.size());
	memset(ctx.types.data, 0, ctx.types.count * sizeof(ctx.types[0]));

	// Reserve functions
	ctx.functions.resize(ctx.ctx.functions.size());
	memset(ctx.functions.data, 0, ctx.functions.count * sizeof(ctx.functions[0]));

	// Create runtime support functions
	{
		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmAbortNoReturn", CompileLlvmFunctionType(ctx, ctx.ctx.typeVoid, ArrayView<TypeBase*>()));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeAutoRef, ctx.ctx.typeTypeID };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmConvertPtr", CompileLlvmFunctionType(ctx, ctx.ctx.typeNullPtr, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeInt, ctx.ctx.typeInt };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmPowInt", CompileLlvmFunctionType(ctx, ctx.ctx.typeInt, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeLong, ctx.ctx.typeLong };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmPowLong", CompileLlvmFunctionType(ctx, ctx.ctx.typeLong, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeDouble, ctx.ctx.typeDouble };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmPowDouble", CompileLlvmFunctionType(ctx, ctx.ctx.typeDouble, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeInt };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmReturnInt", CompileLlvmFunctionType(ctx, ctx.ctx.typeVoid, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeLong };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmReturnLong", CompileLlvmFunctionType(ctx, ctx.ctx.typeVoid, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeDouble };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmReturnDouble", CompileLlvmFunctionType(ctx, ctx.ctx.typeVoid, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeInt, ctx.ctx.typeNullPtr, ctx.ctx.typeNullPtr };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmExternalCall", CompileLlvmFunctionType(ctx, ctx.ctx.typeVoid, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	// Generate functions
	for(unsigned i = 0; i < ctx.ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.ctx.functions[i];

		if(ctx.ctx.IsGenericFunction(function))
			continue;

		// Skip prototypes that will have an implementation later
		if(function->isPrototype && function->implementation)
			continue;

		// Skip if function is already ready
		if(ctx.functions[function->functionIndex])
			continue;

		LLVMValueRef llvmFunction = LLVMAddFunction(ctx.module, CreateLlvmFunctionName(ctx, function), CompileLlvmFunctionType(ctx, function->type));

		if(IsStructReturnType(function->type->returnType))
		{
			LLVMAddAttributeAtIndex(llvmFunction, 1, LLVMCreateEnumAttribute(ctx.context, LLVMGetEnumAttributeKindForName("nonnull", unsigned(strlen("nonnull"))), 0));
			LLVMAddAttributeAtIndex(llvmFunction, 1, LLVMCreateEnumAttribute(ctx.context, LLVMGetEnumAttributeKindForName("sret", unsigned(strlen("sret"))), 0));
		}

		ctx.functions[function->functionIndex] = llvmFunction;

		// Create an external function call wrapper
		if(function->importModule == NULL && function->isPrototype)
			CompileLlvmExternalFunctionWrapper(ctx, function);
	}

	for(unsigned i = 0; i < ctx.ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.ctx.functions[i];

		if(function->isPrototype && function->implementation)
			ctx.functions[function->functionIndex] = ctx.functions[function->implementation->functionIndex];
	}

	// Generate global variables
	for(unsigned i = 0; i < ctx.ctx.variables.size(); i++)
	{
		VariableData *variable = ctx.ctx.variables[i];

		if(ctx.ctx.GlobalScopeFrom(variable->scope))
		{
			LLVMValueRef value = LLVMAddGlobal(ctx.module, CompileLlvmType(ctx, variable->type), CreateLlvmName(ctx, variable->name->name));

			if(!variable->importModule)
				LLVMSetInitializer(value, LLVMConstNull(CompileLlvmType(ctx, variable->type)));

			assert(!ctx.variables.find(variable->uniqueId));

			ctx.variables.insert(variable->uniqueId, value);
		}
	}

	for(unsigned i = 0; i < expression->definitions.size(); i++)
		CompileLlvm(ctx, expression->definitions[i]);

	ctx.skipFunctionDefinitions = true;

	// Generate global function
	{
		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmEntry", LLVMFunctionType(LLVMVoidTypeInContext(ctx.context), NULL, 0, false));

		LLVMSetLinkage(function, LLVMExternalLinkage);

		// Setup global function
		ctx.currentFunction = function;
		ctx.currentFunctionGlobal = true;

		LLVMBasicBlockRef block = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "start");

		LLVMPositionBuilderAtEnd(ctx.builder, block);

		for(ExprBase *value = expression->setup.head; value; value = value->next)
			CompileLlvm(ctx, value);

		for(ExprBase *value = expression->expressions.head; value; value = value->next)
			CompileLlvm(ctx, value);

		LLVMBuildRetVoid(ctx.builder);

		CheckFunction(ctx, ctx.currentFunction, InplaceStr("global"));

		if(LLVMRunFunctionPassManager(ctx.functionPassManager, function))
			LLVMRunFunctionPassManager(ctx.functionPassManager, function);

		ctx.currentFunction = NULL;
		ctx.currentFunctionGlobal = false;
	}

	LLVMFinalizeFunctionPassManager(ctx.functionPassManager);

	char *error = NULL;

	if(LLVMVerifyModule(ctx.module, LLVMReturnStatusAction, &error))
	{
		printf("LLVM module verification failed with:\n%s\n", error);

		LLVMDisposeMessage(error);

		LLVMDisposePassManager(ctx.functionPassManager);

		LLVMDisposeBuilder(ctx.builder);

		LLVMDisposeModule(ctx.module);

		LLVMContextDispose(ctx.context);

		return NULL;
	}

	LLVMDisposeMessage(error);

	LlvmModule *module = new (ctx.get<LlvmModule>()) LlvmModule();

	LLVMMemoryBufferRef buffer = LLVMWriteBitcodeToMemoryBuffer(ctx.module);

	module->moduleSize = (unsigned)LLVMGetBufferSize(buffer);

	module->moduleData = (char*)ctx.allocator->alloc(module->moduleSize);

	if(const char *start = LLVMGetBufferStart(buffer))
		memcpy(module->moduleData, start, module->moduleSize);

	LLVMDisposeMemoryBuffer(buffer);

	LLVMDisposePassManager(ctx.functionPassManager);

	LLVMDisposeBuilder(ctx.builder);

	LLVMDisposeModule(ctx.module);

	LLVMContextDispose(ctx.context);

	return module;
}